

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# betti.h
# Opt level: O0

void __thiscall
betti_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::betti_output_t
          (betti_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t> *this,
          flagser_parameters *params)

{
  undefined2 *in_RSI;
  undefined8 *in_RDI;
  string *in_stack_00000248;
  file_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t> *in_stack_00000250
  ;
  string local_30 [32];
  undefined2 *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(local_30,(string *)(in_RSI + 0x20));
  file_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::file_output_t
            (in_stack_00000250,in_stack_00000248);
  std::__cxx11::string::~string(local_30);
  *in_RDI = &PTR__betti_output_t_00200a78;
  *(undefined2 *)(in_RDI + 0x42) = 0;
  *(undefined2 *)((long)in_RDI + 0x212) = local_10[1];
  *(undefined2 *)((long)in_RDI + 0x214) = *local_10;
  *(undefined2 *)((long)in_RDI + 0x216) = local_10[2];
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1d2c42);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1d2c53);
  *(undefined4 *)(in_RDI + 0x49) = 0;
  *(byte *)((long)in_RDI + 0x24c) = *(byte *)(local_10 + 7) & 1;
  *(byte *)((long)in_RDI + 0x24d) = (*(byte *)(local_10 + 6) ^ 0xff) & 1;
  return;
}

Assistant:

betti_output_t(const flagser_parameters& params)
	    : file_output_t<Complex>(params.output_name), min_dimension(params.min_dimension),
	      max_dimension(params.max_dimension), modulus(params.modulus),
	      approximate_computation(params.approximate_computation),
	      aggregate_results(!params.split_into_connected_components) {}